

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::LegacyScriptPubKeyMan::Upgrade
          (LegacyScriptPubKeyMan *this,int prev_version,int new_version,bilingual_str *error)

{
  ConstevalFormatString<0U> wallet_fmt;
  ConstevalFormatString<0U> wallet_fmt_00;
  bool bVar1;
  byte bVar2;
  undefined1 uVar3;
  uint uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  int in_ESI;
  ScriptPubKeyMan *in_RDI;
  long in_FS_OFFSET;
  bool split_upgrade;
  bool hd_upgrade;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  CPubKey masterPubKey;
  int in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  bilingual_str *in_stack_fffffffffffffe70;
  undefined6 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7e;
  undefined1 in_stack_fffffffffffffe7f;
  undefined8 in_stack_fffffffffffffe88;
  undefined6 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe96;
  undefined1 in_stack_fffffffffffffe97;
  LegacyScriptPubKeyMan *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea4;
  undefined1 in_stack_fffffffffffffea5;
  undefined1 in_stack_fffffffffffffea6;
  undefined1 in_stack_fffffffffffffea7;
  undefined7 in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  undefined6 in_stack_fffffffffffffed8;
  byte bVar5;
  byte bVar6;
  bool local_f2;
  string local_70 [104];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_RDI,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_fffffffffffffea7,
                      CONCAT16(in_stack_fffffffffffffea6,
                               CONCAT15(in_stack_fffffffffffffea5,
                                        CONCAT14(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0
                                                )))),(char *)in_stack_fffffffffffffe98,
             (char *)CONCAT17(in_stack_fffffffffffffe97,
                              CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)),
             (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe88 >> 0x18,0));
  uVar4 = (*in_RDI->m_storage->_vptr_WalletStorage[4])(in_RDI->m_storage,0x100000000);
  uVar3 = (undefined1)uVar4;
  if ((uVar4 & 1) == 0) {
    bVar6 = 0;
    bVar5 = 0;
    bVar1 = IsFeatureSupported(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
    if ((bVar1) &&
       (bVar2 = (**(code **)((long)&((unique_lock *)&in_RDI->_vptr_ScriptPubKeyMan)->_M_device[2].
                                    super___recursive_mutex_base._M_mutex + 0x10))(),
       (bVar2 & 1) == 0)) {
      in_stack_fffffffffffffed0 = "Upgrading wallet to HD\n";
      wallet_fmt.fmt._6_1_ = bVar5;
      wallet_fmt.fmt._0_6_ = in_stack_fffffffffffffed8;
      wallet_fmt.fmt._7_1_ = bVar6;
      ScriptPubKeyMan::WalletLogPrintf<>(in_RDI,wallet_fmt);
      (*in_RDI->m_storage->_vptr_WalletStorage[7])(in_RDI->m_storage,130000,0);
      GenerateNewSeed(in_stack_fffffffffffffe98);
      SetHDSeed(in_stack_fffffffffffffe98,
                (CPubKey *)
                CONCAT17(in_stack_fffffffffffffe97,
                         CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)));
      bVar6 = 1;
    }
    bVar1 = IsFeatureSupported(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
    if ((!bVar1) &&
       (bVar1 = IsFeatureSupported(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68), bVar1)) {
      in_stack_fffffffffffffec8 = "Upgrading wallet to use HD chain split\n";
      wallet_fmt_00.fmt._6_1_ = bVar5;
      wallet_fmt_00.fmt._0_6_ = in_stack_fffffffffffffed8;
      wallet_fmt_00.fmt._7_1_ = bVar6;
      ScriptPubKeyMan::WalletLogPrintf<>(in_RDI,wallet_fmt_00);
      (*in_RDI->m_storage->_vptr_WalletStorage[7])(in_RDI->m_storage,0x297ac,0);
      bVar5 = in_ESI < 0x2227c;
      if (*(int *)&in_RDI[4].NotifyFirstKeyTimeChanged._pimpl.px < 2) {
        *(undefined4 *)&in_RDI[4].NotifyFirstKeyTimeChanged._pimpl.px = 2;
        (*in_RDI->m_storage->_vptr_WalletStorage[3])();
        WalletBatch::WalletBatch
                  ((WalletBatch *)
                   CONCAT17(in_stack_fffffffffffffe7f,
                            CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)),
                   (WalletDatabase *)in_stack_fffffffffffffe70,
                   SUB41((uint)in_stack_fffffffffffffe6c >> 0x18,0));
        bVar1 = WalletBatch::WriteHDChain
                          ((WalletBatch *)
                           CONCAT17(in_stack_fffffffffffffe7f,
                                    CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)),
                           (CHDChain *)in_stack_fffffffffffffe70);
        bVar2 = bVar1 ^ 0xff;
        WalletBatch::~WalletBatch
                  ((WalletBatch *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        if ((bVar2 & 1) != 0) {
          __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffeb8,(char *)CONCAT17(uVar3,in_stack_fffffffffffffeb0),
                     (allocator<char> *)in_RDI);
          std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffffe7f,
                                                CONCAT16(in_stack_fffffffffffffe7e,
                                                         in_stack_fffffffffffffe78)));
          std::runtime_error::runtime_error((runtime_error *)__lhs,local_70);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(__lhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_003f5260;
        }
      }
    }
    if ((bVar5 & 1) != 0) {
      MarkPreSplitKeys((LegacyScriptPubKeyMan *)in_stack_fffffffffffffec8);
    }
    if (((bVar6 & 1) == 0) ||
       (uVar3 = NewKeyPool((LegacyScriptPubKeyMan *)in_stack_fffffffffffffed0), (bool)uVar3)) {
      local_f2 = true;
    }
    else {
      _((ConstevalStringLiteral)0x97ca59);
      bilingual_str::operator=
                ((bilingual_str *)
                 CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)),
                 in_stack_fffffffffffffe70);
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      local_f2 = false;
    }
  }
  else {
    local_f2 = true;
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_f2;
  }
LAB_003f5260:
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::Upgrade(int prev_version, int new_version, bilingual_str& error)
{
    LOCK(cs_KeyStore);

    if (m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        // Nothing to do here if private keys are not enabled
        return true;
    }

    bool hd_upgrade = false;
    bool split_upgrade = false;
    if (IsFeatureSupported(new_version, FEATURE_HD) && !IsHDEnabled()) {
        WalletLogPrintf("Upgrading wallet to HD\n");
        m_storage.SetMinVersion(FEATURE_HD);

        // generate a new master key
        CPubKey masterPubKey = GenerateNewSeed();
        SetHDSeed(masterPubKey);
        hd_upgrade = true;
    }
    // Upgrade to HD chain split if necessary
    if (!IsFeatureSupported(prev_version, FEATURE_HD_SPLIT) && IsFeatureSupported(new_version, FEATURE_HD_SPLIT)) {
        WalletLogPrintf("Upgrading wallet to use HD chain split\n");
        m_storage.SetMinVersion(FEATURE_PRE_SPLIT_KEYPOOL);
        split_upgrade = FEATURE_HD_SPLIT > prev_version;
        // Upgrade the HDChain
        if (m_hd_chain.nVersion < CHDChain::VERSION_HD_CHAIN_SPLIT) {
            m_hd_chain.nVersion = CHDChain::VERSION_HD_CHAIN_SPLIT;
            if (!WalletBatch(m_storage.GetDatabase()).WriteHDChain(m_hd_chain)) {
                throw std::runtime_error(std::string(__func__) + ": writing chain failed");
            }
        }
    }
    // Mark all keys currently in the keypool as pre-split
    if (split_upgrade) {
        MarkPreSplitKeys();
    }
    // Regenerate the keypool if upgraded to HD
    if (hd_upgrade) {
        if (!NewKeyPool()) {
            error = _("Unable to generate keys");
            return false;
        }
    }
    return true;
}